

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QList<QTableWidgetItem_*> * __thiscall
QTableWidget::findItems(QTableWidget *this,QString *text,MatchFlags flags)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  QTableWidgetPrivate *pQVar3;
  qsizetype qVar4;
  undefined4 in_ECX;
  QString *in_RDX;
  qsizetype in_RSI;
  QList<QTableWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  int i;
  int indexCount;
  int column;
  QTableWidgetPrivate *d;
  QList<QTableWidgetItem_*> *items;
  QModelIndexList indexes;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  QList<QModelIndex> *in_stack_fffffffffffffef0;
  QModelIndex *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff18;
  int iVar5;
  int local_c8;
  int local_bc;
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  QList<QModelIndex> local_48;
  undefined4 local_2c;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = in_ECX;
  pQVar3 = d_func((QTableWidget *)0x8dbdee);
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8dbe2d);
  local_bc = 0;
  while (iVar5 = local_bc, iVar2 = columnCount((QTableWidget *)in_stack_ffffffffffffff00),
        iVar5 < iVar2) {
    pQVar1 = (pQVar3->super_QTableViewPrivate).super_QAbstractItemViewPrivate.model;
    in_stack_ffffffffffffff00 =
         (QModelIndex *)QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff00);
    in_stack_ffffffffffffff0c = local_bc;
    QModelIndex::QModelIndex((QModelIndex *)0x8dbe8a);
    (**(code **)(*(long *)in_stack_ffffffffffffff00 + 0x60))
              (local_78,in_stack_ffffffffffffff00,0,in_stack_ffffffffffffff0c,local_90);
    ::QVariant::QVariant(&local_28,in_RDX);
    in_stack_fffffffffffffee8 = local_2c;
    (**(code **)(*(long *)pQVar1 + 0x150))(local_60,pQVar1,local_78,0,&local_28,0xffffffff);
    QList<QModelIndex>::operator+=
              (in_stack_fffffffffffffef0,
               (QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8dbf27);
    ::QVariant::~QVariant(&local_28);
    local_bc = local_bc + 1;
  }
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetItem_*>::QList((QList<QTableWidgetItem_*> *)0x8dbf73);
  qVar4 = QList<QModelIndex>::size(&local_48);
  QList<QTableWidgetItem_*>::reserve
            ((QList<QTableWidgetItem_*> *)CONCAT44(iVar5,in_stack_ffffffffffffff18),in_RSI);
  for (local_c8 = 0; local_c8 < (int)qVar4; local_c8 = local_c8 + 1) {
    QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dbfaf);
    QList<QModelIndex>::at
              (in_stack_fffffffffffffef0,
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QTableModel::item((QTableModel *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      in_stack_ffffffffffffff00);
    QList<QTableWidgetItem_*>::append
              ((QList<QTableWidgetItem_*> *)0x8dbfe0,
               (parameter_type)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8dc010);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QTableWidgetItem*> QTableWidget::findItems(const QString &text, Qt::MatchFlags flags) const
{
    Q_D(const QTableWidget);
    QModelIndexList indexes;
    for (int column = 0; column < columnCount(); ++column)
        indexes += d->model->match(model()->index(0, column, QModelIndex()),
                                     Qt::DisplayRole, text, -1, flags);
    QList<QTableWidgetItem*> items;
    const int indexCount = indexes.size();
    items.reserve(indexCount);
    for (int i = 0; i < indexCount; ++i)
        items.append(d->tableModel()->item(indexes.at(i)));
    return items;
}